

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

void __thiscall
Imath_2_5::Box<Imath_2_5::Vec4<double>_>::extendBy
          (Box<Imath_2_5::Vec4<double>_> *this,Box<Imath_2_5::Vec4<double>_> *box)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  Vec4<double> *in_RSI;
  Vec4<double> *in_RDI;
  uint i;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    uVar2 = Vec4<double>::dimensions();
    if (uVar2 <= local_14) break;
    pdVar3 = Vec4<double>::operator[](in_RSI,local_14);
    dVar1 = *pdVar3;
    pdVar3 = Vec4<double>::operator[](in_RDI,local_14);
    if (dVar1 < *pdVar3) {
      pdVar3 = Vec4<double>::operator[](in_RSI,local_14);
      dVar1 = *pdVar3;
      pdVar3 = Vec4<double>::operator[](in_RDI,local_14);
      *pdVar3 = dVar1;
    }
    pdVar3 = Vec4<double>::operator[](in_RSI + 1,local_14);
    dVar1 = *pdVar3;
    pdVar3 = Vec4<double>::operator[](in_RDI + 1,local_14);
    if (*pdVar3 <= dVar1 && dVar1 != *pdVar3) {
      pdVar3 = Vec4<double>::operator[](in_RSI + 1,local_14);
      dVar1 = *pdVar3;
      pdVar3 = Vec4<double>::operator[](in_RDI + 1,local_14);
      *pdVar3 = dVar1;
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

inline void
Box<T>::extendBy(const Box<T> &box)
{
    for (unsigned int i = 0; i < min.dimensions(); i++)
    {
	if (box.min[i] < min[i])
	    min[i] = box.min[i];

	if (box.max[i] > max[i])
	    max[i] = box.max[i];
    }
}